

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O1

void __thiscall
Memory::HeapInfo::HeapInfo
          (HeapInfo *this,AllocationPolicyManager *policyManager,ConfigFlagsTable *configFlagsTable,
          IdleDecommitPageAllocator *leafPageAllocator)

{
  long lVar1;
  
  *(undefined8 *)((long)&this->newMediumNormalWithBarrierHeapBlockList + 2) = 0;
  *(undefined8 *)((long)&this->newMediumFinalizableWithBarrierHeapBlockList + 2) = 0;
  this->newMediumFinalizableHeapBlockList = (MediumFinalizableHeapBlock *)0x0;
  this->newMediumNormalWithBarrierHeapBlockList = (MediumNormalWithBarrierHeapBlock *)0x0;
  this->newMediumLeafHeapBlockList = (MediumLeafHeapBlock *)0x0;
  this->newMediumNormalHeapBlockList = (MediumNormalHeapBlock *)0x0;
  this->newNormalWithBarrierHeapBlockList = (SmallNormalWithBarrierHeapBlock *)0x0;
  this->newFinalizableWithBarrierHeapBlockList = (SmallFinalizableWithBarrierHeapBlock *)0x0;
  this->newNormalHeapBlockList = (SmallNormalHeapBlock *)0x0;
  this->newFinalizableHeapBlockList = (SmallFinalizableHeapBlock *)0x0;
  this->recycler = (Recycler *)0x0;
  this->newLeafHeapBlockList = (SmallLeafHeapBlock *)0x0;
  (this->smallBlockPageHeapBucketFilter).data[0].word = 0;
  (this->mediumBlockPageHeapBucketFilter).data[0].word = 0;
  this->captureAllocCallStack = false;
  this->captureFreeCallStack = false;
  this->pageHeapBlockType = PageHeapBlockTypeFilterAll;
  lVar1 = 0;
  do {
    SmallNormalHeapBucketBase<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_>::
    SmallNormalHeapBucketBase
              ((SmallNormalHeapBucketBase<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_>
                *)((long)&this->heapBuckets[0].heapBucket.
                          super_SmallNormalHeapBucketBase<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_>
                          .
                          super_HeapBucketT<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_>
                          .super_HeapBucket.heapInfo + lVar1));
    HeapBucketT<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>_>::HeapBucketT
              ((HeapBucketT<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>_> *)
               ((long)&this->heapBuckets[0].leafHeapBucket.
                       super_HeapBucketT<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>_>
                       .super_HeapBucket.heapInfo + lVar1));
    SmallFinalizableHeapBucketBaseT<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_>
    ::SmallFinalizableHeapBucketBaseT
              ((SmallFinalizableHeapBucketBaseT<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_>
                *)((long)&this->heapBuckets[0].finalizableHeapBucket.
                          super_SmallFinalizableHeapBucketBaseT<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_>
                          .
                          super_SmallNormalHeapBucketBase<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_>
                          .
                          super_HeapBucketT<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_>
                          .super_HeapBucket.heapInfo + lVar1));
    SmallNormalHeapBucketBase<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
    ::SmallNormalHeapBucketBase
              ((SmallNormalHeapBucketBase<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
                *)((long)&this->heapBuckets[0].smallNormalWithBarrierHeapBucket.
                          super_SmallNormalHeapBucketBase<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
                          .
                          super_HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
                          .super_HeapBucket.heapInfo + lVar1));
    SmallFinalizableHeapBucketBaseT<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
    ::SmallFinalizableHeapBucketBaseT
              ((SmallFinalizableHeapBucketBaseT<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
                *)((long)&this->heapBuckets[0].smallFinalizableWithBarrierHeapBucket.
                          super_SmallFinalizableHeapBucketBaseT<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
                          .
                          super_SmallNormalHeapBucketBase<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
                          .
                          super_HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
                          .super_HeapBucket.heapInfo + lVar1));
    lVar1 = lVar1 + 0x380;
  } while (lVar1 != 0xa800);
  lVar1 = 0;
  do {
    SmallNormalHeapBucketBase<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>::
    SmallNormalHeapBucketBase
              ((SmallNormalHeapBucketBase<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>
                *)((long)&this->mediumHeapBuckets[0].heapBucket.
                          super_SmallNormalHeapBucketBase<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>
                          .
                          super_HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>
                          .super_HeapBucket.heapInfo + lVar1));
    HeapBucketT<Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>_>::HeapBucketT
              ((HeapBucketT<Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>_> *)
               ((long)&this->mediumHeapBuckets[0].leafHeapBucket.
                       super_HeapBucketT<Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>_>
                       .super_HeapBucket.heapInfo + lVar1));
    SmallFinalizableHeapBucketBaseT<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>
    ::SmallFinalizableHeapBucketBaseT
              ((SmallFinalizableHeapBucketBaseT<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>
                *)((long)&this->mediumHeapBuckets[0].finalizableHeapBucket.
                          super_SmallFinalizableHeapBucketBaseT<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>
                          .
                          super_SmallNormalHeapBucketBase<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>
                          .
                          super_HeapBucketT<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>
                          .super_HeapBucket.heapInfo + lVar1));
    SmallNormalHeapBucketBase<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
    ::SmallNormalHeapBucketBase
              ((SmallNormalHeapBucketBase<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
                *)((long)&this->mediumHeapBuckets[0].smallNormalWithBarrierHeapBucket.
                          super_SmallNormalHeapBucketBase<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
                          .
                          super_HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
                          .super_HeapBucket.heapInfo + lVar1));
    SmallFinalizableHeapBucketBaseT<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
    ::SmallFinalizableHeapBucketBaseT
              ((SmallFinalizableHeapBucketBaseT<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
                *)((long)&this->mediumHeapBuckets[0].smallFinalizableWithBarrierHeapBucket.
                          super_SmallFinalizableHeapBucketBaseT<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
                          .
                          super_SmallNormalHeapBucketBase<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
                          .
                          super_HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
                          .super_HeapBucket.heapInfo + lVar1));
    lVar1 = lVar1 + 0x380;
  } while (lVar1 != 0x6580);
  HeapBucket::HeapBucket(&(this->largeObjectBucket).super_HeapBucket);
  (this->largeObjectBucket).pendingSweepLargeBlockList = (LargeHeapBlock *)0x0;
  (this->largeObjectBucket).partialSweptLargeBlockList = (LargeHeapBlock *)0x0;
  (this->largeObjectBucket).largePageHeapBlockList = (LargeHeapBlock *)0x0;
  (this->largeObjectBucket).pendingDisposeLargeBlockList = (LargeHeapBlock *)0x0;
  (this->largeObjectBucket).fullLargeBlockList = (LargeHeapBlock *)0x0;
  (this->largeObjectBucket).largeBlockList = (LargeHeapBlock *)0x0;
  (this->largeObjectBucket).supportFreeList = false;
  (this->largeObjectBucket).freeList = (LargeHeapBlockFreeList *)0x0;
  (this->largeObjectBucket).explicitFreeList = (FreeObject *)0x0;
  this->hasPendingTransferDisposedObjects = false;
  this->liveFinalizableObjectCount = 0;
  this->newFinalizableObjectCount = 0;
  this->pendingDisposableObjectCount = 0;
  this->recyclerLeafPageAllocator = leafPageAllocator;
  RecyclerPageAllocator::RecyclerPageAllocator
            (&this->recyclerWithBarrierPageAllocator,this,policyManager,configFlagsTable,
             RecyclerHeuristic::Instance.DefaultMaxFreePageCount,0x20,true);
  RecyclerPageAllocator::RecyclerPageAllocator
            (&this->recyclerPageAllocator,this,policyManager,configFlagsTable,
             RecyclerHeuristic::Instance.DefaultMaxFreePageCount,
             RecyclerHeuristic::Instance.DefaultMaxAllocPageCount,false);
  RecyclerPageAllocator::RecyclerPageAllocator
            (&this->recyclerLargeBlockPageAllocator,this,policyManager,configFlagsTable,
             RecyclerHeuristic::Instance.DefaultMaxFreePageCount,0x20,false);
  (this->recyclerPageAllocator).super_IdleDecommitPageAllocator.super_PageAllocator.debugName =
       L"Recycler";
  (this->recyclerLargeBlockPageAllocator).super_IdleDecommitPageAllocator.super_PageAllocator.
  debugName = L"RecyclerLargeBlock";
  (this->recyclerWithBarrierPageAllocator).super_IdleDecommitPageAllocator.super_PageAllocator.
  debugName = L"RecyclerWithBarrier";
  return;
}

Assistant:

HeapInfo::HeapInfo(AllocationPolicyManager * policyManager, Js::ConfigFlagsTable& configFlagsTable, IdleDecommitPageAllocator * leafPageAllocator) :
    recycler(nullptr),
    recyclerLeafPageAllocator(leafPageAllocator),
    recyclerPageAllocator(this, policyManager, configFlagsTable, RecyclerHeuristic::Instance.DefaultMaxFreePageCount, RecyclerHeuristic::Instance.DefaultMaxAllocPageCount),
    recyclerLargeBlockPageAllocator(this, policyManager, configFlagsTable, RecyclerHeuristic::Instance.DefaultMaxFreePageCount),
#ifdef RECYCLER_WRITE_BARRIER_ALLOC_SEPARATE_PAGE
    recyclerWithBarrierPageAllocator(this, policyManager, configFlagsTable, RecyclerHeuristic::Instance.DefaultMaxFreePageCount, PageAllocator::DefaultMaxAllocPageCount, true),
#endif
#if ENABLE_CONCURRENT_GC
    newLeafHeapBlockList(nullptr),
    newNormalHeapBlockList(nullptr),
#ifdef RECYCLER_WRITE_BARRIER
    newNormalWithBarrierHeapBlockList(nullptr),
    newFinalizableWithBarrierHeapBlockList(nullptr),
#endif
    newFinalizableHeapBlockList(nullptr),
#ifdef RECYCLER_VISITED_HOST
    newRecyclerVisitedHostHeapBlockList(nullptr),
#endif
    newMediumLeafHeapBlockList(nullptr),
    newMediumNormalHeapBlockList(nullptr),
#ifdef RECYCLER_WRITE_BARRIER
    newMediumNormalWithBarrierHeapBlockList(nullptr),
    newMediumFinalizableWithBarrierHeapBlockList(nullptr),
#endif
#ifdef RECYCLER_VISITED_HOST
    newMediumRecyclerVisitedHostHeapBlockList(nullptr),
#endif
    newMediumFinalizableHeapBlockList(nullptr),
#endif
#ifdef RECYCLER_FINALIZE_CHECK
    liveFinalizableObjectCount(0),
    pendingDisposableObjectCount(0),
    newFinalizableObjectCount(0),
#endif
#ifdef RECYCLER_PAGE_HEAP
    pageHeapMode(PageHeapMode::PageHeapModeOff),
    isPageHeapEnabled(false),
    pageHeapBlockType(PageHeapBlockTypeFilter::PageHeapBlockTypeFilterAll),
    captureAllocCallStack(false),
    captureFreeCallStack(false),
#endif
    hasPendingTransferDisposedObjects(false)
{
#if DBG_DUMP
    recyclerPageAllocator.debugName = _u("Recycler");
    recyclerLargeBlockPageAllocator.debugName = _u("RecyclerLargeBlock");
#ifdef RECYCLER_WRITE_BARRIER_ALLOC_SEPARATE_PAGE
    recyclerWithBarrierPageAllocator.debugName = _u("RecyclerWithBarrier");
#endif
#endif
}